

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

void __thiscall
QCachedPainter::QCachedPainter
          (QCachedPainter *this,QPainter *painter,QString *cachePrefix,QStyleOption *option,
          QSize size,QRect paintRect)

{
  undefined8 uVar1;
  Representation RVar2;
  bool bVar3;
  byte bVar4;
  pointer value;
  undefined8 in_RCX;
  QSize in_RSI;
  QRect *in_RDI;
  QSize in_R8;
  long in_FS_OFFSET;
  qreal dpr;
  QSize sz;
  QString *in_stack_ffffffffffffff58;
  QPixmap *in_stack_ffffffffffffff60;
  QPixmap *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QRect *size_00;
  QStyleOption *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  QPixmap local_48 [48];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  this_00 = (QPixmap *)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->x1 = (Representation)in_RSI.wd.m_i;
  in_RDI->y1 = (Representation)in_RSI.ht.m_i;
  in_RDI->x2 = (Representation)(int)in_RCX;
  in_RDI->y2 = (Representation)(int)((ulong)in_RCX >> 0x20);
  size_00 = in_RDI;
  local_10 = in_R8;
  std::unique_ptr<QPainter,std::default_delete<QPainter>>::
  unique_ptr<std::default_delete<QPainter>,void>
            ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_stack_ffffffffffffff60);
  QString::QString((QString *)0x40b887);
  QPixmap::QPixmap((QPixmap *)(in_RDI + 3));
  uVar1 = *(undefined8 *)this_00;
  in_RDI[4].x2 = (Representation)(int)uVar1;
  in_RDI[4].y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
  RVar2.m_i = *(int *)(this_00 + 0xc);
  in_RDI[5].x1 = (Representation)*(int *)(this_00 + 8);
  in_RDI[5].y1 = (Representation)RVar2.m_i;
  *(undefined1 *)((long)&in_RDI[5].x2.m_i + 1) = 0;
  local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  bVar3 = QSize::isEmpty((QSize *)in_RDI);
  if (bVar3) {
    local_18 = QRect::size(in_RDI);
  }
  else {
    local_18 = local_10;
  }
  QStyleHelper::getDpr((QPainter *)0x40b906);
  QStyleHelper::uniqueName
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(QSize *)size_00,(qreal)in_RSI);
  QString::operator=((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QString::~QString((QString *)0x40b94b);
  bVar4 = QPixmapCache::find((QString *)&in_RDI[1].x2,(QPixmap *)(in_RDI + 3));
  *(byte *)&in_RDI[5].x2.m_i = bVar4 & 1;
  if ((in_RDI[5].x2.m_i & 1) == 0) {
    styleCachePixmap((QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (qreal)in_RDI);
    QPixmap::operator=(this_00,in_stack_ffffffffffffff60);
    QPixmap::~QPixmap(local_48);
    std::make_unique<QPainter,QPixmap*>((QPixmap **)this_00);
    std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::operator=
              ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_stack_ffffffffffffff60,
               (unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_stack_ffffffffffffff58);
    std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr
              ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_stack_ffffffffffffff60);
    value = std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::operator->
                      ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)0x40b9f4);
    bVar3 = (bool)QPainter::renderHints();
    QPainter::setRenderHints((QFlags_conflict1 *)value,bVar3);
    QSet<QString>::operator+=((QSet<QString> *)this_00,(QString *)value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCachedPainter::QCachedPainter(QPainter *painter, const QString &cachePrefix,
                               const QStyleOption *option, QSize size, QRect paintRect)
    : m_painter(painter)
    , m_option(option)
    , m_paintRect(paintRect)
{
    const auto sz = size.isEmpty() ? option->rect.size() : size;
    const qreal dpr = QStyleHelper::getDpr(painter);
    m_pixmapName = QStyleHelper::uniqueName(cachePrefix, option, sz, dpr);
    m_alreadyCached = QPixmapCache::find(m_pixmapName, &m_pixmap);
    if (!m_alreadyCached) {
        m_pixmap = styleCachePixmap(sz, dpr);
        m_pixmapPainter = std::make_unique<QPainter>(&m_pixmap);
        m_pixmapPainter->setRenderHints(painter->renderHints());
        s_pixmapCacheKeys += m_pixmapName;
    }
}